

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

roaring64_bitmap_t * roaring64_bitmap_copy(roaring64_bitmap_t *r)

{
  art_key_chunk_t aVar1;
  roaring64_bitmap_t *art;
  container_t *pcVar2;
  art_val_t *val;
  uint8_t result_typecode;
  art_iterator_t it;
  art_key_chunk_t local_b1;
  art_iterator_t local_b0;
  
  art = (roaring64_bitmap_t *)roaring_malloc(0x10);
  (art->art).root = (art_node_t *)0x0;
  art->flags = '\0';
  art_init_iterator(&local_b0,&r->art,true);
  if (local_b0.value != (art_val_t *)0x0) {
    do {
      local_b1 = local_b0.value[1].key[0];
      pcVar2 = get_copy_of_container(*(container_t **)(local_b0.value[1].key + 2),&local_b1,false);
      aVar1 = local_b1;
      val = (art_val_t *)roaring_malloc(0x10);
      *(container_t **)(val[1].key + 2) = pcVar2;
      val[1].key[0] = aVar1;
      art_insert((art_t *)art,local_b0.key,val);
      art_iterator_next(&local_b0);
    } while (local_b0.value != (art_val_t *)0x0);
  }
  return art;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_copy(const roaring64_bitmap_t *r) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        uint8_t result_typecode = leaf->typecode;
        container_t *result_container = get_copy_of_container(
            leaf->container, &result_typecode, /*copy_on_write=*/false);
        leaf_t *result_leaf = create_leaf(result_container, result_typecode);
        art_insert(&result->art, it.key, (art_val_t *)result_leaf);
        art_iterator_next(&it);
    }
    return result;
}